

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metainfo.c
# Opt level: O2

int ndn_metainfo_tlv_encode(ndn_encoder_t *encoder,ndn_metainfo_t *meta)

{
  uint uVar1;
  ulong uVar2;
  uint32_t uVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  uint32_t var;
  int iVar7;
  long lVar8;
  uint32_t var_00;
  uint var_01;
  
  var_01 = (uint)(meta->enable_ContentType != '\0') * 3;
  if (meta->enable_FreshnessPeriod != '\0') {
    uVar2 = meta->freshness_period;
    if (uVar2 < 0x100) {
      iVar4 = 3;
    }
    else if (uVar2 < 0x10000) {
      iVar4 = 4;
    }
    else {
      iVar4 = (uint)(uVar2 >> 0x20 != 0) * 4 + 6;
    }
    var_01 = var_01 + iVar4;
  }
  var_00 = 1;
  if (meta->enable_FinalBlockId == '\0') {
    var = 0;
    if (var_01 == 0) {
      return 0;
    }
  }
  else {
    uVar1 = (meta->final_block_id).type;
    uVar6 = (uint)(meta->final_block_id).size;
    uVar3 = (0xffff < uVar1) + 3 + (uint)(0xffff < uVar1);
    if (uVar1 < 0xfd) {
      uVar3 = var_00;
    }
    var = uVar3 + uVar6 + (uint)(0xfc < uVar6) * 2 + 1;
    var_01 = uVar3 + uVar6 + (uint)(0xfc < uVar6) * 2 + var_01 + (uint)(0xfc < var) * 2 + 3;
  }
  if (encoder->output_max_size < encoder->offset + var_01 + (uint)(0xfc < var_01) * 2 + 2) {
    return -10;
  }
  iVar4 = encoder_append_var(encoder,0x14);
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = encoder_append_var(encoder,var_01);
  if (iVar4 == 0) {
    if (meta->enable_ContentType != '\0') {
      iVar4 = encoder_append_var(encoder,0x18);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = encoder_append_var(encoder,1);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = encoder_append_byte_value(encoder,meta->content_type);
      if (iVar4 != 0) {
        return iVar4;
      }
    }
    if (meta->enable_FreshnessPeriod != '\0') {
      iVar4 = encoder_append_var(encoder,0x19);
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar2 = meta->freshness_period;
      if (0xff < uVar2) {
        if (uVar2 < 0x10000) {
          var_00 = 2;
        }
        else {
          var_00 = (uint)(uVar2 >> 0x20 != 0) * 4 + 4;
        }
      }
      iVar4 = encoder_append_var(encoder,var_00);
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar2 = meta->freshness_period;
      if (uVar2 < 0x100) {
        iVar4 = encoder_append_byte_value(encoder,(uint8_t)uVar2);
        if (iVar4 != 0) {
          return iVar4;
        }
      }
      else {
        if (uVar2 < 0x10000) {
          if (encoder->output_max_size < encoder->offset + 2) {
            return -10;
          }
          encoder->output_value[encoder->offset] = (uint8_t)(uVar2 >> 8);
          encoder->output_value[encoder->offset + 1] = (uint8_t)uVar2;
          iVar4 = 2;
        }
        else if (uVar2 >> 0x20 == 0) {
          if (encoder->output_max_size < encoder->offset + 4) {
            return -10;
          }
          bVar5 = 0x18;
          iVar4 = 4;
          for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
            encoder->output_value[encoder->offset + iVar7] =
                 (uint8_t)((uint)uVar2 >> (bVar5 & 0x1f));
            bVar5 = bVar5 - 8;
          }
        }
        else {
          if (encoder->output_max_size < encoder->offset + 8) {
            return -10;
          }
          bVar5 = 0x38;
          iVar4 = 8;
          for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
            encoder->output_value[encoder->offset + (int)lVar8] = (uint8_t)(uVar2 >> (bVar5 & 0x3f))
            ;
            bVar5 = bVar5 - 8;
          }
        }
        encoder->offset = encoder->offset + iVar4;
      }
    }
    if ((meta->enable_FinalBlockId == '\0') ||
       (((iVar4 = encoder_append_var(encoder,0x1a), iVar4 == 0 &&
         (iVar4 = encoder_append_var(encoder,var), iVar4 == 0)) &&
        (iVar4 = name_component_tlv_encode(encoder,&meta->final_block_id), iVar4 == 0)))) {
      iVar4 = 0;
    }
    return iVar4;
  }
  return iVar4;
}

Assistant:

int
ndn_metainfo_tlv_encode(ndn_encoder_t* encoder, const ndn_metainfo_t* meta)
{

  int ret_val = -1;
  
  uint32_t meta_value_size = 0;
  uint32_t comp_tlv_size = 0;
  if (meta->enable_ContentType) {
    meta_value_size += encoder_probe_block_size(TLV_ContentType, 1);
  }
  if (meta->enable_FreshnessPeriod) {
    meta_value_size += encoder_probe_block_size(TLV_FreshnessPeriod, 
                                                encoder_probe_uint_length(meta->freshness_period));
  }
  if (meta->enable_FinalBlockId) {
    comp_tlv_size = name_component_probe_block_size(&meta->final_block_id);
    meta_value_size += encoder_probe_block_size(TLV_FinalBlockId, comp_tlv_size);
  }

  if (meta_value_size == 0)
    return 0;

  if (encoder->offset + encoder_probe_block_size(TLV_MetaInfo, meta_value_size)
      > encoder->output_max_size)
    return NDN_OVERSIZE;

  ret_val = encoder_append_type(encoder, TLV_MetaInfo);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_length(encoder, meta_value_size);
  if (ret_val != NDN_SUCCESS) return ret_val;

  if (meta->enable_ContentType) {
    ret_val = encoder_append_type(encoder, TLV_ContentType);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 1);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_byte_value(encoder, meta->content_type);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  if (meta->enable_FreshnessPeriod) {
    ret_val = encoder_append_type(encoder, TLV_FreshnessPeriod);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, encoder_probe_uint_length(meta->freshness_period));
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint_value(encoder, meta->freshness_period);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  if (meta->enable_FinalBlockId) {
    ret_val = encoder_append_type(encoder, TLV_FinalBlockId);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, comp_tlv_size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = name_component_tlv_encode(encoder, &meta->final_block_id);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  return 0;
}